

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::SimpleString(SimpleString *this,char *other,size_t repeatCount)

{
  char *result;
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  sVar4 = 1 - repeatCount;
  lVar6 = -1;
  do {
    sVar4 = sVar4 + repeatCount;
    lVar5 = lVar6 + 1;
    lVar6 = lVar6 + 1;
  } while (other[lVar5] != '\0');
  setInternalBufferToNewBuffer(this,sVar4);
  pcVar1 = this->buffer_;
  if (repeatCount != 0) {
    pcVar2 = pcVar1 + 1;
    sVar4 = 0;
    do {
      if (pcVar1 != (char *)0x0 && lVar6 != -1) {
        cVar3 = *other;
        *pcVar1 = cVar3;
        if (lVar6 != 0) {
          lVar5 = 0;
          do {
            if (cVar3 == '\0') break;
            cVar3 = other[lVar5 + 1];
            pcVar2[lVar5] = cVar3;
            lVar5 = lVar5 + 1;
          } while (lVar6 != lVar5);
        }
      }
      pcVar1 = pcVar1 + lVar6;
      sVar4 = sVar4 + 1;
      pcVar2 = pcVar2 + lVar6;
    } while (sVar4 != repeatCount);
  }
  *pcVar1 = '\0';
  return;
}

Assistant:

SimpleString::SimpleString(const char *other, size_t repeatCount)
    : buffer_(NULLPTR), bufferSize_(0)
{
    size_t otherStringLength = StrLen(other);
    setInternalBufferToNewBuffer(otherStringLength * repeatCount + 1);

    char* next = buffer_;
    for (size_t i = 0; i < repeatCount; i++) {
        StrNCpy(next, other, otherStringLength + 1);
        next += otherStringLength;
    }
    *next = 0;
}